

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvers.cpp
# Opt level: O2

vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_> *
getPredefinedTransformations1M1Q<float>
          (vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
           *__return_storage_ptr__,Matrix<float,_6,_1,_0,_6,_1> *l1,Matrix<float,_6,_1,_0,_6,_1> *l2
          )

{
  CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *pCVar1;
  float fVar2;
  float fVar3;
  Matrix<float,_3,_1,_0,_3,_1> ey;
  Matrix<float,_3,_1,_0,_3,_1> ex;
  Matrix<float,_3,_1,_0,_3,_1> U2_3;
  Matrix<float,_3,_1,_0,_3,_1> U1_3;
  Matrix<float,_3,_1,_0,_3,_1> U2_1;
  Matrix<float,_3,_1,_0,_3,_1> U1_1;
  Matrix<float,_3,_1,_0,_3,_1> u2;
  Matrix<float,_3,_1,_0,_3,_1> dir2;
  undefined8 local_538;
  float local_530;
  undefined8 local_528;
  float local_520;
  undefined8 local_518;
  float local_510;
  undefined8 local_508;
  float local_500;
  Matrix<float,_6,_6,_0,_6,_6> TUL1;
  Matrix<float,_6,_6,_0,_6,_6> TUL2;
  Matrix<float,_4,_4,_0,_4,_4> TU1;
  Matrix<float,_3,_1,_0,_3,_1> local_398;
  Matrix<float,_3,_1,_0,_3,_1> local_388;
  undefined8 local_378;
  float local_370;
  undefined8 local_368;
  float local_360;
  Matrix<float,_3,_1,_0,_3,_1> u1;
  Matrix<float,_3,_1,_0,_3,_1> m2;
  Matrix<float,_3,_1,_0,_3,_1> m1;
  Matrix<float,_3,_1,_0,_3,_1> dir1;
  Matrix<float,_4,_4,_0,_4,_4> TU;
  Matrix<float,_6,_6,_0,_6,_6> TuL1;
  PlainObjectBase<Eigen::Matrix<float,4,4,0,4,4>> *local_258;
  Matrix<float,_4,_4,_0,_4,_4> *local_250;
  Matrix<float,_4,_4,_0,_4,_4> TU_B;
  Matrix<float,_6,_1,_0,_6,_1> lu2;
  Matrix<float,_6,_1,_0,_6,_1> lu1;
  Matrix<float,_4,_4,_0,_4,_4> TU2;
  Matrix<float,_4,_4,_0,_4,_4> Tu2;
  Matrix<float,_4,_4,_0,_4,_4> Tu1;
  Matrix<float,_3,_3,_0,_3,_3> U2;
  Matrix<float,_3,_3,_0,_3,_3> U1;
  Matrix<float,_6,_6,_0,_6,_6> TuL2;
  
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
            ((Type *)&TuL1,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)l1,3);
  Eigen::PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>>::
  PlainObjectBase<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>>
            ((PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>> *)&dir1,
             (DenseBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)&TuL1);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::tail<int>
            ((Type *)&TuL1,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)l1,3);
  Eigen::PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>>::
  PlainObjectBase<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>>
            ((PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>> *)&m1,
             (DenseBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)&TuL1);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
            ((Type *)&TuL1,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)l2,3);
  Eigen::PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>>::
  PlainObjectBase<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>>
            ((PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>> *)&dir2,
             (DenseBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)&TuL1);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::tail<int>
            ((Type *)&TuL1,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)l2,3);
  Eigen::PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>>::
  PlainObjectBase<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>>
            ((PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>> *)&m2,
             (DenseBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)&TuL1);
  local_360 = dir1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[0] *
              m1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
              [1] - m1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                    array[0] *
                    dir1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                    m_data.array[1];
  local_368 = CONCAT44(m1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array[0] *
                       dir1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array[2] -
                       dir1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array[0] *
                       m1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array[2],
                       m1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array[2] *
                       dir1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array[1] -
                       dir1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array[2] *
                       m1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array[1]);
  local_370 = dir2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[0] *
              m2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
              [1] - m2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                    array[0] *
                    dir2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                    m_data.array[1];
  local_378 = CONCAT44(m2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array[0] *
                       dir2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array[2] -
                       dir2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array[0] *
                       m2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array[2],
                       m2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array[2] *
                       dir2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array[1] -
                       dir2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array[2] *
                       m2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array[1]);
  TUL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array._0_8_ =
       &local_368;
  TUL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array._8_8_ =
       (PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>> *)&dir1;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
                    *)&TuL2,(Product<Eigen::Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0>
                             *)&TUL1,(StorageBaseType *)&dir1);
  TuL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] =
       TuL2.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2];
  TuL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[6] =
       TuL2.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4];
  TuL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[7] =
       TuL2.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5];
  TuL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array._0_8_ =
       &local_368;
  Eigen::PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,3,1,0,3,1>const>const,Eigen::Matrix<float,3,1,0,3,1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>> *)&u1,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>_>
              *)&TuL1);
  TUL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array._8_8_ =
       &dir2;
  TUL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array._0_8_ =
       &local_378;
  Eigen::operator*((CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>
                    *)&TuL2,(Product<Eigen::Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_0>
                             *)&TUL1,
                   (StorageBaseType *)
                   TUL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data
                   .array._8_8_);
  TuL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] =
       TuL2.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2];
  TuL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[6] =
       TuL2.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4];
  TuL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[7] =
       TuL2.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5];
  TuL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array._0_8_ =
       &local_378;
  Eigen::PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>>::
  PlainObjectBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,float>,Eigen::Matrix<float,3,1,0,3,1>const,Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,3,1,0,3,1>const>const,Eigen::Matrix<float,3,1,0,3,1>const>const>>
            ((PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>> *)&u2,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<float,_float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<float,_3,_1,_0,_3,_1>_>_>_>
              *)&TuL1);
  Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::Identity();
  Eigen::PlainObjectBase<Eigen::Matrix<float,4,4,0,4,4>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,4,4,0,4,4>>>
            ((PlainObjectBase<Eigen::Matrix<float,4,4,0,4,4>> *)&Tu1,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
              *)&TuL1);
  Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::Identity();
  Eigen::PlainObjectBase<Eigen::Matrix<float,4,4,0,4,4>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,4,4,0,4,4>>>
            ((PlainObjectBase<Eigen::Matrix<float,4,4,0,4,4>> *)&Tu2,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
              *)&TuL1);
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topRightCorner<int,int>
            ((Type *)&TuL1,(PlainObjectBase<Eigen::Matrix<float,4,4,0,4,4>> *)&Tu1,3,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,Eigen::Matrix<float,3,1,0,3,1>>
            ((Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)&TuL1,&u1);
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topRightCorner<int,int>
            ((Type *)&TuL1,(PlainObjectBase<Eigen::Matrix<float,4,4,0,4,4>> *)&Tu2,3,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,Eigen::Matrix<float,3,1,0,3,1>>
            ((Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)&TuL1,&u2);
  Eigen::MatrixBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>::Identity();
  Eigen::PlainObjectBase<Eigen::Matrix<float,6,6,0,6,6>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,6,6,0,6,6>>>
            ((PlainObjectBase<Eigen::Matrix<float,6,6,0,6,6>> *)&TuL1,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_6,_6,_0,_6,_6>_>_>
              *)&TuL2);
  Eigen::MatrixBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>::Identity();
  Eigen::PlainObjectBase<Eigen::Matrix<float,6,6,0,6,6>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,6,6,0,6,6>>>
            ((PlainObjectBase<Eigen::Matrix<float,6,6,0,6,6>> *)&TuL2,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_6,_6,_0,_6,_6>_>_>
              *)&TUL1);
  local_388.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       u1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
  local_388.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       u1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  local_388.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       u1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  getSkew<float>((Matrix<float,_3,_3,_0,_3,_3> *)&TUL2,&local_388);
  TU1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._0_8_ =
       &TUL2;
  Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false> *)&TUL1,&TuL1,3,0,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::Matrix<float,3,3,0,3,3>const>>
            ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false> *)&TUL1,
             (CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
              *)&TU1);
  local_398.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       u2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0];
  local_398.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       u2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  local_398.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       u2.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  getSkew<float>((Matrix<float,_3,_3,_0,_3,_3> *)&TUL2,&local_398);
  TU1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._0_8_ =
       &TUL2;
  Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false> *)&TUL1,&TuL2,3,0,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,Eigen::Matrix<float,3,3,0,3,3>const>>
            ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false> *)&TUL1,
             (CwiseUnaryOp<Eigen::internal::scalar_opposite_op<float>,_const_Eigen::Matrix<float,_3,_3,_0,_3,_3>_>
              *)&TU1);
  TUL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array._0_8_ =
       (PlainObjectBase<Eigen::Matrix<float,6,6,0,6,6>> *)&TuL1;
  TUL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array._8_8_ = l1
  ;
  Eigen::PlainObjectBase<Eigen::Matrix<float,6,1,0,6,1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<float,6,6,0,6,6>,Eigen::Matrix<float,6,1,0,6,1>,0>>
            ((PlainObjectBase<Eigen::Matrix<float,6,1,0,6,1>> *)&lu1,
             (DenseBase<Eigen::Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>_>
              *)&TUL1);
  TUL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array._0_8_ =
       (PlainObjectBase<Eigen::Matrix<float,6,6,0,6,6>> *)&TuL2;
  TUL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array._8_8_ = l2
  ;
  Eigen::PlainObjectBase<Eigen::Matrix<float,6,1,0,6,1>>::
  PlainObjectBase<Eigen::Product<Eigen::Matrix<float,6,6,0,6,6>,Eigen::Matrix<float,6,1,0,6,1>,0>>
            ((PlainObjectBase<Eigen::Matrix<float,6,1,0,6,1>> *)&lu2,
             (DenseBase<Eigen::Product<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_Eigen::Matrix<float,_6,_1,_0,_6,_1>,_0>_>
              *)&TUL1);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
            ((Type *)&TUL1,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&lu1,3);
  Eigen::PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>>::
  PlainObjectBase<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>>
            ((PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>> *)&U1_3,
             (DenseBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)&TUL1);
  Eigen::DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_>::head<int>
            ((Type *)&TUL1,(DenseBase<Eigen::Matrix<float,_6,_1,_0,_6,_1>_> *)&lu2,3);
  Eigen::PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>>::
  PlainObjectBase<Eigen::Block<Eigen::Matrix<float,6,1,0,6,1>,_1,1,false>>
            ((PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>> *)&U2_3,
             (DenseBase<Eigen::Block<Eigen::Matrix<float,_6,_1,_0,_6,_1>,__1,_1,_false>_> *)&TUL1);
  TUL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array._0_8_ =
       &ex;
  TUL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] = 0.0;
  TUL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] = 0.0;
  TUL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] =
       1.4013e-45;
  TUL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5] = 0.0;
  TUL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[6] =
       1.4013e-45;
  TUL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[7] = 0.0;
  ex.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] = 1.0;
  TUL2.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] = 0.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&TUL1,
                      (Scalar *)&TUL2);
  TU1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._0_8_ =
       TU1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._0_8_
       & 0xffffffff00000000;
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_(pCVar1,(Scalar *)&TU1);
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::finished
            ((CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&TUL1);
  TUL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array._0_8_ =
       &ey;
  TUL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] = 0.0;
  TUL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[3] = 0.0;
  ey.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] = 0.0;
  TUL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[4] =
       1.4013e-45;
  TUL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[5] = 0.0;
  TUL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[6] =
       1.4013e-45;
  TUL1.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[7] = 0.0;
  TUL2.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] = 1.0;
  pCVar1 = Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_
                     ((CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&TUL1,
                      (Scalar *)&TUL2);
  TU1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._0_8_ =
       TU1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._0_8_
       & 0xffffffff00000000;
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::operator_(pCVar1,(Scalar *)&TU1);
  Eigen::CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::finished
            ((CommaInitializer<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&TUL1);
  fVar2 = U1_3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
  ;
  fVar3 = U1_3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
  ;
  local_508 = CONCAT44(ey.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array[2] *
                       U1_3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array[0] -
                       ey.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array[0] * fVar3,
                       ey.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array[1] * fVar3 -
                       ey.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array[2] * fVar2);
  local_500 = ey.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
              [0] * fVar2 -
              U1_3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[0] *
              ey.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
              [1];
  local_518 = CONCAT44(U1_3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array[0] *
                       ex.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array[2] -
                       ex.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array[0] * fVar3,
                       fVar3 * ex.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                               m_storage.m_data.array[1] -
                       ex.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array[2] * fVar2);
  local_510 = ex.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
              [0] * fVar2 -
              U1_3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[0] *
              ex.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
              [1];
  Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::norm
            ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&local_508);
  Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::norm
            ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&local_518);
  Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::normalized
            ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&TUL1);
  Eigen::internal::call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::Matrix<float,3,1,0,3,1>>
            (&U1_1,(Matrix<float,_3,_1,_0,_3,_1> *)&TUL1);
  TUL2.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array._0_8_ =
       &U1_1;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false,_true> *)&TUL1,
                  &U1,0);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,3,3,0,3,3>,1,3,false>,Eigen::Transpose<Eigen::Matrix<float,3,1,0,3,1>>>
            ((Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false> *)&TUL1,
             (Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&TUL2);
  TUL2.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[2] =
       U1_3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       U1_1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] -
       U1_1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       U1_3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  TUL2.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[1] =
       U1_1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       U1_3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] -
       U1_3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       U1_1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  TUL2.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array[0] =
       U1_1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] *
       U1_3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] -
       U1_3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] *
       U1_1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  TU1.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._0_8_ =
       &TUL2;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false,_true> *)&TUL1,
                  &U1,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,3,3,0,3,3>,1,3,false>,Eigen::Transpose<Eigen::Matrix<float,3,1,0,3,1>>>
            ((Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false> *)&TUL1,
             (Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&TU1);
  TUL2.super_PlainObjectBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>.m_storage.m_data.array._0_8_ =
       (PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>> *)&U1_3;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false,_true> *)&TUL1,
                  &U1,2);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,3,3,0,3,3>,1,3,false>,Eigen::Transpose<Eigen::Matrix<float,3,1,0,3,1>>>
            ((Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false> *)&TUL1,
             (Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&TUL2);
  Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::Identity();
  Eigen::PlainObjectBase<Eigen::Matrix<float,4,4,0,4,4>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,4,4,0,4,4>>>
            ((PlainObjectBase<Eigen::Matrix<float,4,4,0,4,4>> *)&TU1,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
              *)&TUL1);
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
            ((Type *)&TUL1,(PlainObjectBase<Eigen::Matrix<float,4,4,0,4,4>> *)&TU1,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,Eigen::Matrix<float,3,3,0,3,3>>
            ((Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)&TUL1,&U1);
  Eigen::MatrixBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>::Identity();
  Eigen::PlainObjectBase<Eigen::Matrix<float,6,6,0,6,6>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,6,6,0,6,6>>>
            ((PlainObjectBase<Eigen::Matrix<float,6,6,0,6,6>> *)&TUL1,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_6,_6,_0,_6,_6>_>_>
              *)&TUL2);
  Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::topLeftCorner<int,int>
            ((Type *)&TUL2,(PlainObjectBase<Eigen::Matrix<float,6,6,0,6,6>> *)&TUL1,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false>,Eigen::Matrix<float,3,3,0,3,3>>
            ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false> *)&TUL2,&U1);
  Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false> *)&TUL2,&TUL1,3,3,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false>,Eigen::Matrix<float,3,3,0,3,3>>
            ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false> *)&TUL2,&U1);
  fVar2 = U2_3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1]
  ;
  fVar3 = U2_3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2]
  ;
  local_528 = CONCAT44(ey.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array[2] *
                       U2_3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array[0] -
                       ey.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array[0] * fVar3,
                       ey.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array[1] * fVar3 -
                       ey.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array[2] * fVar2);
  local_520 = ey.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
              [0] * fVar2 -
              U2_3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[0] *
              ey.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
              [1];
  local_538 = CONCAT44(U2_3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array[0] *
                       ex.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array[2] -
                       ex.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array[0] * fVar3,
                       fVar3 * ex.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.
                               m_storage.m_data.array[1] -
                       ex.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array[2] * fVar2);
  local_530 = ex.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
              [0] * fVar2 -
              U2_3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array[0] *
              ex.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
              [1];
  Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::norm
            ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&local_528);
  Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::norm
            ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&local_538);
  Eigen::MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>::normalized
            ((MatrixBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&TUL2);
  Eigen::internal::call_assignment<Eigen::Matrix<float,3,1,0,3,1>,Eigen::Matrix<float,3,1,0,3,1>>
            (&U2_1,(Matrix<float,_3,_1,_0,_3,_1> *)&TUL2);
  TU2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._0_8_ =
       &U2_1;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false,_true> *)&TUL2,
                  &U2,0);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,3,3,0,3,3>,1,3,false>,Eigen::Transpose<Eigen::Matrix<float,3,1,0,3,1>>>
            ((Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false> *)&TUL2,
             (Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&TU2);
  TU2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2] =
       U2_3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       U2_1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] -
       U2_1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       U2_3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  TU2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[1] =
       U2_1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       U2_3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] -
       U2_3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] *
       U2_1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2];
  TU2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[0] =
       U2_1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] *
       U2_3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] -
       U2_3.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] *
       U2_1.super_PlainObjectBase<Eigen::Matrix<float,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1];
  TU.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._0_8_ = &TU2
  ;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false,_true> *)&TUL2,
                  &U2,1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,3,3,0,3,3>,1,3,false>,Eigen::Transpose<Eigen::Matrix<float,3,1,0,3,1>>>
            ((Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false> *)&TUL2,
             (Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&TU);
  TU2.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._0_8_ =
       (PlainObjectBase<Eigen::Matrix<float,3,1,0,3,1>> *)&U2_3;
  Eigen::internal::BlockImpl_dense<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false,_true>::
  BlockImpl_dense((BlockImpl_dense<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false,_true> *)&TUL2,
                  &U2,2);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,3,3,0,3,3>,1,3,false>,Eigen::Transpose<Eigen::Matrix<float,3,1,0,3,1>>>
            ((Block<Eigen::Matrix<float,_3,_3,_0,_3,_3>,_1,_3,_false> *)&TUL2,
             (Transpose<Eigen::Matrix<float,_3,_1,_0,_3,_1>_> *)&TU2);
  Eigen::MatrixBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>::Identity();
  Eigen::PlainObjectBase<Eigen::Matrix<float,4,4,0,4,4>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,4,4,0,4,4>>>
            ((PlainObjectBase<Eigen::Matrix<float,4,4,0,4,4>> *)&TU2,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
              *)&TUL2);
  Eigen::DenseBase<Eigen::Matrix<float,4,4,0,4,4>>::topLeftCorner<int,int>
            ((Type *)&TUL2,(PlainObjectBase<Eigen::Matrix<float,4,4,0,4,4>> *)&TU2,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,4,4,0,4,4>,_1,_1,false>,Eigen::Matrix<float,3,3,0,3,3>>
            ((Block<Eigen::Matrix<float,_4,_4,_0,_4,_4>,__1,__1,_false> *)&TUL2,&U2);
  Eigen::MatrixBase<Eigen::Matrix<float,_6,_6,_0,_6,_6>_>::Identity();
  Eigen::PlainObjectBase<Eigen::Matrix<float,6,6,0,6,6>>::
  _set_noalias<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,Eigen::Matrix<float,6,6,0,6,6>>>
            ((PlainObjectBase<Eigen::Matrix<float,6,6,0,6,6>> *)&TUL2,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<float>,_Eigen::Matrix<float,_6,_6,_0,_6,_6>_>_>
              *)&TU);
  Eigen::DenseBase<Eigen::Matrix<float,6,6,0,6,6>>::topLeftCorner<int,int>
            ((Type *)&TU,(PlainObjectBase<Eigen::Matrix<float,6,6,0,6,6>> *)&TUL2,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false>,Eigen::Matrix<float,3,3,0,3,3>>
            ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false> *)&TU,&U2);
  Eigen::Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,_-1,_-1,_false>::Block
            ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false> *)&TU,&TUL2,3,3,3,3);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<float,6,6,0,6,6>,_1,_1,false>,Eigen::Matrix<float,3,3,0,3,3>>
            ((Block<Eigen::Matrix<float,_6,_6,_0,_6,_6>,__1,__1,_false> *)&TU,&U2);
  TU_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._8_8_ =
       &Tu1;
  TU_B.super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>.m_storage.m_data.array._0_8_ =
       (PlainObjectBase<Eigen::Matrix<float,4,4,0,4,4>> *)&TU1;
  Eigen::PlainObjectBase<Eigen::Matrix<float,4,4,0,4,4>>::
  _set_noalias<Eigen::Product<Eigen::Matrix<float,4,4,0,4,4>,Eigen::Matrix<float,4,4,0,4,4>,0>>
            ((PlainObjectBase<Eigen::Matrix<float,4,4,0,4,4>> *)&TU,
             (DenseBase<Eigen::Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>_>
              *)&TU_B);
  local_250 = &Tu2;
  local_258 = (PlainObjectBase<Eigen::Matrix<float,4,4,0,4,4>> *)&TU2;
  Eigen::PlainObjectBase<Eigen::Matrix<float,4,4,0,4,4>>::
  _set_noalias<Eigen::Product<Eigen::Matrix<float,4,4,0,4,4>,Eigen::Matrix<float,4,4,0,4,4>,0>>
            ((PlainObjectBase<Eigen::Matrix<float,4,4,0,4,4>> *)&TU_B,
             (DenseBase<Eigen::Product<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_Eigen::Matrix<float,_4,_4,_0,_4,_4>,_0>_>
              *)&local_258);
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  ::push_back(__return_storage_ptr__,(value_type *)&TU);
  std::
  vector<Eigen::Matrix<float,_4,_4,_0,_4,_4>,_std::allocator<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>_>
  ::push_back(__return_storage_ptr__,&TU_B);
  return __return_storage_ptr__;
}

Assistant:

vector<Matrix<floatPrec, 4,4>> getPredefinedTransformations1M1Q(Matrix<floatPrec, 6,1> l1, Matrix<floatPrec, 6,1> l2){

	// get closest point --in the line-- to the origin
	Eigen::Matrix<floatPrec,3,1> dir1 = l1.head(3), m1 = l1.tail(3);
	Eigen::Matrix<floatPrec,3,1> dir2 = l2.head(3), m2 = l2.tail(3);
	Eigen::Matrix<floatPrec,3,1> x1 = dir1.cross(m1);
	Eigen::Matrix<floatPrec,3,1> x2 = dir2.cross(m2);
	
	// get transform to translate frames to the line
	Eigen::Matrix<floatPrec,3,1> u1 = x1 - x1.transpose()*dir1*dir1;
	Eigen::Matrix<floatPrec,3,1> u2 = x2 - x2.transpose()*dir2*dir2;
	Eigen::Matrix<floatPrec,4,4> Tu1 = Eigen::Matrix<floatPrec,4,4>::Identity(), Tu2 = Eigen::Matrix<floatPrec,4,4>::Identity();
	Tu1.topRightCorner(3,1) = u1;
	Tu2.topRightCorner(3,1) = u2;
	Eigen::Matrix<floatPrec,6,6> TuL1 = Eigen::Matrix<floatPrec,6,6>::Identity(), TuL2 = Eigen::Matrix<floatPrec,6,6>::Identity();
	TuL1.block(3,0,3,3) = -getSkew<floatPrec>(u1);
	TuL2.block(3,0,3,3) = -getSkew<floatPrec>(u2);

	// transform point and line to new ref
	Eigen::Matrix<floatPrec,6,1> lu1 = TuL1*l1;
	Eigen::Matrix<floatPrec,6,1> lu2 = TuL2*l2;

	//align z axis with line direction
	Eigen::Matrix<floatPrec,3,1> U1_3 = lu1.head(3), U2_3 = lu2.head(3);
	Eigen::Matrix<floatPrec,3,1> ex, ey;
	ex << 1,0,0; ey << 0,1,0;
	Eigen::Matrix<floatPrec,3,1> U1_1, U2_1;
	// frame A
	Eigen::Matrix<floatPrec,3,1> U1_3M = ey.cross(U1_3);
	Eigen::Matrix<floatPrec,3,1> U1_3P = ex.cross(U1_3);
	if(U1_3M.norm() > U1_3P.norm())
		U1_1 = U1_3M.normalized();
	else
		U1_1 = U1_3P.normalized();
	Eigen::Matrix<floatPrec,3,3> U1;
	U1.row(0) = U1_1.transpose();
	U1.row(1) = U1_3.cross(U1_1).transpose();
	U1.row(2) = U1_3.transpose();
	Eigen::Matrix<floatPrec,4,4> TU1 = Eigen::Matrix<floatPrec,4,4>::Identity();
	TU1.topLeftCorner(3,3) = U1;
	Eigen::Matrix<floatPrec,6,6> TUL1 = Eigen::Matrix<floatPrec,6,6>::Identity();
	TUL1.topLeftCorner(3,3) = U1; TUL1.block(3,3,3,3) = U1;
	// frame B
	Eigen::Matrix<floatPrec,3,1> U2_3M = ey.cross(U2_3);
	Eigen::Matrix<floatPrec,3,1> U2_3P = ex.cross(U2_3);
	if(U2_3M.norm() > U2_3P.norm())
		U2_1 = U2_3M.normalized();
	else
		U2_1 = U2_3P.normalized();
	Eigen::Matrix<floatPrec,3,3> U2;
	U2.row(0) = U2_1.transpose();
	U2.row(1) = U2_3.cross(U2_1).transpose();
	U2.row(2) = U2_3.transpose();
	Eigen::Matrix<floatPrec,4,4> TU2 = Eigen::Matrix<floatPrec,4,4>::Identity();
	TU2.topLeftCorner(3,3) = U2;
	Eigen::Matrix<floatPrec,6,6> TUL2 = Eigen::Matrix<floatPrec,6,6>::Identity();
	TUL2.topLeftCorner(3,3) = U2; TUL2.block(3,3,3,3) = U2;

	Eigen::Matrix<floatPrec,4,4> TU = TU1*Tu1;
	Eigen::Matrix<floatPrec,4,4> TU_B = TU2*Tu2;

	std::vector<Eigen::Matrix<floatPrec,4,4>> trans;
	trans.push_back(TU);
	trans.push_back(TU_B);

	return trans;

}